

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

QByteArray * __thiscall Moc::toFullyQualified(Moc *this,QByteArray *name)

{
  Span *pSVar1;
  ulong uVar2;
  piter pVar3;
  
  pVar3 = (piter)QHash<QByteArray,_QByteArray>::constFindImpl<QByteArray>
                           (&this->knownQObjectClasses,name);
  if ((pVar3.d == (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0 && pVar3.bucket == 0) &&
     (pVar3 = (piter)QHash<QByteArray,_QByteArray>::constFindImpl<QByteArray>
                               (&this->knownGadgets,name),
     pVar3.d == (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0 && pVar3.bucket == 0)) {
    return name;
  }
  pSVar1 = (pVar3.d)->spans;
  uVar2 = pVar3.bucket >> 7;
  return (QByteArray *)
         (pSVar1[uVar2].entries[pSVar1[uVar2].offsets[(uint)pVar3.bucket & 0x7f]].storage.data +
         0x18);
}

Assistant:

const QByteArray &Moc::toFullyQualified(const QByteArray &name) const noexcept
{
    if (auto it = knownQObjectClasses.find(name); it != knownQObjectClasses.end())
        return it.value();
    if (auto it = knownGadgets.find(name); it != knownGadgets.end())
        return it.value();
    return name;
}